

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

void printAllIntVectors(Vec_Ptr_t *vDisjunctions,Abc_Ntk_t *pNtk,char *fileName)

{
  int iVar1;
  FILE *__stream;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  char *pcVar2;
  FILE *fp;
  char *hintSubStr;
  char *name;
  int local_30;
  int iElem;
  int j;
  int i;
  Vec_Int_t *vElem;
  char *fileName_local;
  Abc_Ntk_t *pNtk_local;
  Vec_Ptr_t *vDisjunctions_local;
  
  __stream = fopen(fileName,"a");
  iElem = 0;
  do {
    iVar1 = Vec_PtrSize(vDisjunctions);
    if (iVar1 <= iElem) {
      fclose(__stream);
      return;
    }
    p = (Vec_Int_t *)Vec_PtrEntry(vDisjunctions,iElem);
    fprintf(__stream,"( ");
    for (local_30 = 0; iVar1 = Vec_IntSize(p), local_30 < iVar1; local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(p,local_30);
      pObj = Abc_NtkPo(pNtk,iVar1);
      pcVar2 = Abc_ObjName(pObj);
      pcVar2 = strstr(pcVar2,"hint");
      if (pcVar2 == (char *)0x0) {
        __assert_fail("hintSubStr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/disjunctiveMonotone.c"
                      ,0x202,"void printAllIntVectors(Vec_Ptr_t *, Abc_Ntk_t *, char *)");
      }
      fprintf(__stream,"%s",pcVar2);
      iVar1 = Vec_IntSize(p);
      if (local_30 < iVar1 + -1) {
        fprintf(__stream," || ");
      }
      else {
        fprintf(__stream," )\n");
      }
    }
    iElem = iElem + 1;
  } while( true );
}

Assistant:

void printAllIntVectors(Vec_Ptr_t *vDisjunctions, Abc_Ntk_t *pNtk, char *fileName)
{
    Vec_Int_t *vElem;
    int i, j, iElem;
    char *name, *hintSubStr;
    FILE *fp;

    fp = fopen( fileName, "a" );

    Vec_PtrForEachEntry(Vec_Int_t *, vDisjunctions, vElem, i)
    {    
        fprintf(fp, "( ");
        Vec_IntForEachEntry( vElem, iElem, j )
        {
            name = Abc_ObjName( Abc_NtkPo(pNtk, iElem));
            hintSubStr = strstr( name, "hint");
            assert( hintSubStr );
            fprintf(fp, "%s", hintSubStr);
            if( j < Vec_IntSize(vElem) - 1 )
            {
                fprintf(fp, " || ");
            }
            else
            {
                fprintf(fp, " )\n");
            }
        }
    }
    fclose(fp);
}